

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphcycles.cc
# Opt level: O0

void __thiscall
absl::lts_20250127::synchronization_internal::GraphCycles::RemoveNode(GraphCycles *this,void *ptr)

{
  uint uVar1;
  bool bVar2;
  uint uVar3;
  Node **ppNVar4;
  uintptr_t uVar5;
  int32_t local_38;
  uint32_t local_34;
  int32_t _cursor_1;
  int32_t y_1;
  int32_t _cursor;
  int32_t y;
  Node *x;
  void *pvStack_18;
  int32_t i;
  void *ptr_local;
  GraphCycles *this_local;
  
  pvStack_18 = ptr;
  ptr_local = this;
  x._4_4_ = anon_unknown_0::PointerMap::Remove(&this->rep_->ptrmap_,ptr);
  if (x._4_4_ != 0xffffffff) {
    ppNVar4 = anon_unknown_0::
              Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::
              operator[](&this->rep_->nodes_,x._4_4_);
    __cursor = *ppNVar4;
    _cursor_1 = 0;
    while (bVar2 = anon_unknown_0::NodeSet::Next(&__cursor->out,&_cursor_1,&y_1), bVar2) {
      ppNVar4 = anon_unknown_0::
                Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::
                operator[](&this->rep_->nodes_,y_1);
      anon_unknown_0::NodeSet::erase(&(*ppNVar4)->in,x._4_4_);
    }
    local_38 = 0;
    while (bVar2 = anon_unknown_0::NodeSet::Next(&__cursor->in,&local_38,(int32_t *)&local_34),
          bVar2) {
      ppNVar4 = anon_unknown_0::
                Vec<absl::lts_20250127::synchronization_internal::(anonymous_namespace)::Node_*>::
                operator[](&this->rep_->nodes_,local_34);
      anon_unknown_0::NodeSet::erase(&(*ppNVar4)->out,x._4_4_);
    }
    anon_unknown_0::NodeSet::clear(&__cursor->in);
    anon_unknown_0::NodeSet::clear(&__cursor->out);
    uVar5 = base_internal::HidePtr<void>((void *)0x0);
    __cursor->masked_ptr = uVar5;
    uVar1 = __cursor->version;
    uVar3 = std::numeric_limits<unsigned_int>::max();
    if (uVar1 != uVar3) {
      __cursor->version = __cursor->version + 1;
      anon_unknown_0::Vec<int>::push_back(&this->rep_->free_nodes_,(int *)((long)&x + 4));
    }
  }
  return;
}

Assistant:

void GraphCycles::RemoveNode(void* ptr) {
  int32_t i = rep_->ptrmap_.Remove(ptr);
  if (i == -1) {
    return;
  }
  Node* x = rep_->nodes_[static_cast<uint32_t>(i)];
  HASH_FOR_EACH(y, x->out) {
    rep_->nodes_[static_cast<uint32_t>(y)]->in.erase(i);
  }
  HASH_FOR_EACH(y, x->in) {
    rep_->nodes_[static_cast<uint32_t>(y)]->out.erase(i);
  }
  x->in.clear();
  x->out.clear();
  x->masked_ptr = base_internal::HidePtr<void>(nullptr);
  if (x->version == std::numeric_limits<uint32_t>::max()) {
    // Cannot use x any more
  } else {
    x->version++;  // Invalidates all copies of node.
    rep_->free_nodes_.push_back(i);
  }
}